

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_deserialize_integer_Test::TestBody(JsonParser_deserialize_integer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_120 [8];
  Message local_118 [12];
  int local_10c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_108;
  object local_f8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [28];
  int local_7c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_78;
  object local_68;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  json_parser parser;
  JsonParser_deserialize_integer_Test *this_local;
  
  jessilib::json_parser::json_parser((json_parser *)&gtest_ar.message_);
  local_78 = sv("1234",4);
  jessilib::parser::deserialize<char8_t>(&local_68,(parser *)&gtest_ar.message_,local_78);
  local_7c = 0x4d2;
  testing::internal::EqHelper::Compare<jessilib::object,_int,_nullptr>
            ((EqHelper *)local_28,"parser.deserialize(u8\"1234\"sv)","1234",&local_68,&local_7c);
  jessilib::object::~object(&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_108 = sv("-1234",5);
  jessilib::parser::deserialize<char8_t>(&local_f8,(parser *)&gtest_ar.message_,local_108);
  local_10c = -0x4d2;
  testing::internal::EqHelper::Compare<jessilib::object,_int,_nullptr>
            ((EqHelper *)local_b0,"parser.deserialize(u8\"-1234\"sv)","-1234",&local_f8,&local_10c);
  jessilib::object::~object(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    testing::Message::~Message(local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST(JsonParser, deserialize_integer) {
	json_parser parser;

	EXPECT_EQ(parser.deserialize(u8"1234"sv), 1234);
	EXPECT_EQ(parser.deserialize(u8"-1234"sv), -1234);
}